

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

void __thiscall
slang::syntax::SyntaxTree::SyntaxTree
          (SyntaxTree *this,SyntaxNode *root,SourceManager *sourceManager,BumpAllocator *alloc,
          SourceLibrary *library,shared_ptr<slang::syntax::SyntaxTree> *parent)

{
  BumpAllocator *this_00;
  unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  *this_01;
  pointer ppDVar1;
  undefined8 __p;
  element_type *peVar2;
  size_t i;
  ulong uVar3;
  Token TVar4;
  value_type macro;
  undefined1 local_110 [224];
  
  this->isLibraryUnit = false;
  this->rootNode = root;
  this->library = library;
  this->sourceMan = sourceManager;
  this_00 = &this->alloc;
  BumpAllocator::BumpAllocator(this_00,alloc);
  (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map(&(this->options_).items);
  this_01 = &this->metadata;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->metadata)._M_t.
  super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  ._M_t.
  super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
  .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl =
       (ParserMetadata *)0x0;
  (this->macros).
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsing::ParserMetadata::fromSyntax((ParserMetadata *)(local_110 + 8),root);
  std::make_unique<slang::parsing::ParserMetadata,slang::parsing::ParserMetadata>
            ((ParserMetadata *)local_110);
  __p = local_110._0_8_;
  local_110._0_8_ =
       (__uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
        )0x0;
  std::
  __uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
  ::reset((__uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
           *)this_01,(pointer)__p);
  std::
  unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>::
  ~unique_ptr((unique_ptr<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
               *)local_110);
  parsing::ParserMetadata::~ParserMetadata((ParserMetadata *)(local_110 + 8));
  peVar2 = (parent->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar2 != (element_type *)0x0) {
    for (uVar3 = 0;
        ppDVar1 = (peVar2->macros).
                  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(peVar2->macros).
                              super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3);
        uVar3 = uVar3 + 1) {
      local_110._8_8_ = ppDVar1[uVar3];
      if ((DefineDirectiveSyntax *)local_110._8_8_ != (DefineDirectiveSyntax *)0x0) {
        local_110._8_8_ = deepClone((SyntaxNode *)local_110._8_8_,this_00);
      }
      std::
      vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ::push_back(&this->macros,(value_type *)(local_110 + 8));
      peVar2 = (parent->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    }
    if ((((this_01->_M_t).
          super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
          ._M_t.
          super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
          .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl)->eofToken).
        info == (Info *)0x0) {
      TVar4 = parsing::Token::deepClone
                        ((Token *)((long)(peVar2->metadata)._M_t.
                                         super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
                                         .
                                         super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>
                                  + 0xc0),this_00);
      ((this_01->_M_t).
       super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
       ._M_t.
       super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
       .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl)->eofToken =
           TVar4;
    }
  }
  return;
}

Assistant:

SyntaxTree::SyntaxTree(SyntaxNode* root, SourceManager& sourceManager, BumpAllocator&& alloc,
                       const SourceLibrary* library, const std::shared_ptr<SyntaxTree>& parent) :
    rootNode(root), library(library), sourceMan(sourceManager), alloc(std::move(alloc)) {
    metadata = std::make_unique<ParserMetadata>(ParserMetadata::fromSyntax(*root));
    if (parent) { // copy parent's info
        for (size_t i = 0; i < parent->macros.size(); ++i) {
            auto macro = parent->macros[i];
            if (macro)
                macro = deepClone(*macro, this->alloc);
            macros.push_back(macro);
        }
        if (!metadata->eofToken)
            metadata->eofToken = parent->getMetadata().eofToken.deepClone(this->alloc);
    }
}